

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall ary::CameraModel::CameraModel(CameraModel *this,string *calibration)

{
  char cVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  FileStorage fs;
  Mat td;
  Mat ti;
  FileNode local_1a0 [24];
  undefined1 local_188 [24];
  uchar *puStack_170;
  float local_168;
  FileStorage local_128 [64];
  Mat local_e8;
  Mat local_88;
  
  this->_vptr_CameraModel = (_func_int **)&PTR__CameraModel_001256a8;
  (this->intrinsics).val[0] = 0.0;
  (this->intrinsics).val[1] = 0.0;
  (this->intrinsics).val[2] = 0.0;
  (this->intrinsics).val[3] = 0.0;
  (this->intrinsics).val[4] = 0.0;
  (this->intrinsics).val[5] = 0.0;
  (this->intrinsics).val[6] = 0.0;
  (this->intrinsics).val[7] = 0.0;
  (this->intrinsics).val[8] = 0.0;
  cv::Mat::Mat(&this->distortion);
  cv::FileStorage::FileStorage(local_128);
  local_188._8_4_ = 0;
  local_188._12_4_ = 0;
  local_188[0x10] = 0;
  local_188._0_8_ = local_188 + 0x10;
  cVar1 = cv::FileStorage::open((string *)local_128,(int)calibration,(string *)0x0);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_);
  }
  if (cVar1 != '\0') {
    cv::Mat::Mat(&local_88);
    cv::Mat::Mat(&local_e8);
    cv::FileStorage::operator[]((char *)local_1a0);
    cv::Mat::Mat((Mat *)local_188);
    cv::read(local_1a0,&local_88,(Mat *)local_188);
    cv::Mat::~Mat((Mat *)local_188);
    cv::FileStorage::operator[]((char *)local_1a0);
    cv::Mat::Mat((Mat *)local_188);
    cv::read(local_1a0,&local_e8,(Mat *)local_188);
    cv::Mat::~Mat((Mat *)local_188);
    cv::Mat::operator_cast_to_Matx((Matx<float,_3,_3> *)local_188,&local_88);
    (this->intrinsics).val[8] = local_168;
    *(ulong *)((this->intrinsics).val + 4) = CONCAT71(local_188._17_7_,local_188[0x10]);
    *(uchar **)((this->intrinsics).val + 6) = puStack_170;
    *(undefined8 *)(this->intrinsics).val = local_188._0_8_;
    *(undefined8 *)((this->intrinsics).val + 2) = local_188._8_8_;
    cv::Mat::operator=(&this->distortion,&local_e8);
    cv::Mat::~Mat(&local_e8);
    cv::Mat::~Mat(&local_88);
    cv::FileStorage::~FileStorage(local_128);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  this_00 = (runtime_error *)operator_new(0x10);
  std::runtime_error::runtime_error(this_00,"Calibration file does not extist");
  *puVar2 = this_00;
  __cxa_throw(puVar2,&std::runtime_error*::typeinfo,0);
}

Assistant:

CameraModel::CameraModel(const string& calibration) {

    FileStorage fs;

    if (!fs.open(calibration, FileStorage::READ))
        throw new runtime_error("Calibration file does not extist");

    Mat ti, td;

    fs["intrinsics"] >> ti;
    fs["distortion"] >> td;

    intrinsics = ti;
    distortion = td;
}